

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O0

void __thiscall Clasp::Asp::LogicProgram::transformExtended(LogicProgram *this)

{
  size_type sVar1;
  bool bVar2;
  size_type sVar3;
  uint uVar4;
  uint32 uVar5;
  size_t sVar6;
  LogicProgram *in_RDI;
  Span<int> SVar7;
  Strategy st;
  Rule rAux2;
  Rule rAux1;
  Lit_t auxB;
  Atom_t aux;
  Rule r;
  size_type i;
  RuleTransform tm;
  uint32 a;
  LogicProgram *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  Body_t in_stack_fffffffffffffe64;
  LogicProgram *in_stack_fffffffffffffe68;
  Rule *in_stack_fffffffffffffe70;
  undefined5 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7d;
  undefined1 in_stack_fffffffffffffe7e;
  undefined1 in_stack_fffffffffffffe7f;
  RuleTransform *in_stack_fffffffffffffe80;
  int *in_stack_fffffffffffffe90;
  Strategy in_stack_fffffffffffffedc;
  Rule *in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffee8;
  Rule *in_stack_ffffffffffffff18;
  LogicProgram *in_stack_ffffffffffffff20;
  Head_t local_bc [3];
  Span<unsigned_int> SStack_b0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  Lit_t local_78;
  Atom_t local_74;
  undefined4 local_70;
  E local_6c;
  Head_t local_68 [2];
  Span<unsigned_int> SStack_60;
  undefined4 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  size_type local_1c;
  uint32 local_c;
  
  local_c = numAtoms((LogicProgram *)0x17e511);
  RuleTransform::RuleTransform
            (in_stack_fffffffffffffe80,
             (LogicProgram *)
             CONCAT17(in_stack_fffffffffffffe7f,
                      CONCAT16(in_stack_fffffffffffffe7e,
                               CONCAT15(in_stack_fffffffffffffe7d,in_stack_fffffffffffffe78))));
  SVar7.size = in_stack_fffffffffffffee8;
  SVar7.first = in_stack_fffffffffffffe90;
  local_1c = 0;
  do {
    sVar1 = local_1c;
    sVar3 = bk_lib::pod_vector<Potassco::RuleBuilder_*,_std::allocator<Potassco::RuleBuilder_*>_>::
            size(&in_RDI->extended_);
    if (sVar1 == sVar3) {
      bk_lib::pod_vector<Potassco::RuleBuilder_*,_std::allocator<Potassco::RuleBuilder_*>_>::clear
                (&in_RDI->extended_);
      uVar5 = numAtoms((LogicProgram *)0x17e92b);
      incTrAux(in_RDI,uVar5 - local_c);
      RuleTransform::~RuleTransform((RuleTransform *)CONCAT44(uVar5,in_stack_fffffffffffffe60));
      return;
    }
    bk_lib::pod_vector<Potassco::RuleBuilder_*,_std::allocator<Potassco::RuleBuilder_*>_>::
    operator[](&in_RDI->extended_,local_1c);
    Potassco::RuleBuilder::rule((RuleBuilder *)in_RDI);
    local_6c = local_68[0].val_;
    upStat(in_stack_fffffffffffffe68,(Head_t)(E)((ulong)in_stack_fffffffffffffe70 >> 0x20),
           in_stack_fffffffffffffe64.val_);
    local_70 = uStack_50;
    upStat(in_stack_fffffffffffffe58,in_stack_fffffffffffffe64,0);
    bVar2 = Potassco::Rule_t::normal((Rule_t *)0x17e5f6);
    if (bVar2) {
LAB_0017e641:
      RuleTransform::transform
                ((RuleTransform *)SVar7.size,in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    }
    else {
      uVar4 = Potassco::Head_t::operator_cast_to_unsigned_int(local_68);
      if (uVar4 == 0) {
        sVar6 = Potassco::size<unsigned_int>(&SStack_60);
        if (sVar6 < 2) goto LAB_0017e641;
      }
      local_74 = newAtom((LogicProgram *)SVar7.first);
      local_78 = Potassco::lit(local_74);
      local_88 = local_38;
      local_98 = local_48;
      uStack_90 = uStack_40;
      SStack_b0.size = SStack_60.size;
      SStack_b0.first = SStack_60.first;
      Potassco::Head_t::Head_t(local_bc,Disjunctive);
      SStack_b0 = Potassco::toSpan<unsigned_int>(&local_74,1);
      SVar7 = Potassco::toSpan<int>(&local_78,1);
      in_stack_fffffffffffffee0 = (Rule *)SVar7.first;
      Potassco::Rule_t::normal
                ((Head_t)(E)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                 (AtomSpan *)in_stack_fffffffffffffe68,
                 (LitSpan *)CONCAT44(in_stack_fffffffffffffe64.val_,in_stack_fffffffffffffe60));
      in_stack_fffffffffffffe7f =
           handleNatively((LogicProgram *)
                          CONCAT17(in_stack_fffffffffffffe7f,
                                   CONCAT16(in_stack_fffffffffffffe7e,
                                            CONCAT15(in_stack_fffffffffffffe7d,
                                                     in_stack_fffffffffffffe78))),
                          in_stack_fffffffffffffe70);
      if ((bool)in_stack_fffffffffffffe7f) {
        addRule(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
      else {
        in_stack_fffffffffffffe7e =
             transformNoAux((LogicProgram *)
                            CONCAT44(in_stack_fffffffffffffe64.val_,in_stack_fffffffffffffe60),
                            (Rule *)in_stack_fffffffffffffe58);
        in_stack_fffffffffffffedc = (Strategy)(byte)in_stack_fffffffffffffe7e;
        RuleTransform::transform
                  ((RuleTransform *)SVar7.size,in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      }
      in_stack_fffffffffffffe7d =
           handleNatively((LogicProgram *)
                          CONCAT17(in_stack_fffffffffffffe7f,
                                   CONCAT16(in_stack_fffffffffffffe7e,
                                            CONCAT15(in_stack_fffffffffffffe7d,
                                                     in_stack_fffffffffffffe78))),
                          in_stack_fffffffffffffe70);
      if ((bool)in_stack_fffffffffffffe7d) {
        addRule(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
      else {
        RuleTransform::transform
                  ((RuleTransform *)SVar7.size,in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      }
    }
    in_stack_fffffffffffffe70 =
         (Rule *)bk_lib::
                 pod_vector<Potassco::RuleBuilder_*,_std::allocator<Potassco::RuleBuilder_*>_>::
                 operator[](&in_RDI->extended_,local_1c);
    in_stack_fffffffffffffe68 = *(LogicProgram **)in_stack_fffffffffffffe70;
    if (in_stack_fffffffffffffe68 != (LogicProgram *)0x0) {
      Potassco::RuleBuilder::~RuleBuilder
                ((RuleBuilder *)CONCAT44(in_stack_fffffffffffffe64.val_,in_stack_fffffffffffffe60));
      operator_delete(in_stack_fffffffffffffe68);
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

void LogicProgram::transformExtended() {
	uint32 a = numAtoms();
	RuleTransform tm(*this);
	for (RuleList::size_type i = 0; i != extended_.size(); ++i) {
		Rule r = extended_[i]->rule();
		upStat(r.ht, -1);
		upStat(r.bt, -1);
		if (r.normal() || (r.ht == Head_t::Disjunctive && Potassco::size(r.head) < 2)) {
			tm.transform(r);
		}
		else {
			using Potassco::Lit_t;
			Atom_t aux = newAtom();
			Lit_t auxB = Potassco::lit(aux);
			Rule rAux1 = r; // aux :- body
			rAux1.ht   = Head_t::Disjunctive;
			rAux1.head = Potassco::toSpan(&aux, 1);
			Rule rAux2 = Rule::normal(r.ht, r.head, Potassco::toSpan(&auxB, 1));  // head :- auxB
			if (handleNatively(rAux1)) { addRule(rAux1); }
			else {
				RuleTransform::Strategy st = transformNoAux(rAux1) ? RuleTransform::strategy_no_aux : RuleTransform::strategy_default;
				tm.transform(rAux1, st);
			}
			if (handleNatively(rAux2)) { addRule(rAux2); }
			else                       { tm.transform(rAux2); }
		}
		delete extended_[i];
	}
	extended_.clear();
	incTrAux(numAtoms() - a);
}